

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManWriteNames(FILE *pFile,char c,int n,Vec_Ptr_t *vNames,int Start,int Skip,
                      Vec_Bit_t *vObjs)

{
  bool bVar1;
  int d;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int i;
  
  d = Abc_Base10Log(n);
  i = 0;
  if (n < 1) {
    n = 0;
  }
  bVar1 = true;
  do {
    if (n == i) {
      return;
    }
    if (vObjs == (Vec_Bit_t *)0x0) {
LAB_001fab3f:
      Gia_ObjGetDumpName(vNames,c,i,d);
      sVar3 = strlen(Gia_ObjGetDumpName::pBuffer);
      Start = Start + (int)sVar3 + 2;
      if (Start < 0x3d) {
        pcVar4 = "";
        if (!bVar1) {
          pcVar4 = ", ";
        }
      }
      else {
        fwrite(",\n    ",6,1,(FILE *)pFile);
        pcVar4 = "";
        Start = Skip;
      }
      bVar1 = false;
      fprintf((FILE *)pFile,"%s%s",pcVar4,Gia_ObjGetDumpName::pBuffer);
    }
    else {
      iVar2 = Vec_BitEntry(vObjs,i);
      if (iVar2 != 0) goto LAB_001fab3f;
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Gia_ManWriteNames( FILE * pFile, char c, int n, Vec_Ptr_t * vNames, int Start, int Skip, Vec_Bit_t * vObjs )
{
    int Digits = Abc_Base10Log( n );
    int Length = Start, i, fFirst = 1; 
    char * pName;
    for ( i = 0; i < n; i++ )
    {
        if ( vObjs && !Vec_BitEntry(vObjs, i) )
            continue;
        pName = Gia_ObjGetDumpName( vNames, c, i, Digits );
        Length += strlen(pName) + 2;
        if ( Length > 60 )
        {
            fprintf( pFile, ",\n    " );
            Length = Skip;
            fFirst = 1;
        }
        fprintf( pFile, "%s%s", fFirst ? "":", ", pName );
        fFirst = 0;
    }
}